

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall Parser::parse_subroutine_call(Parser *this)

{
  string *__rhs;
  VM_Writer *pVVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  string method_name;
  string type_name;
  allocator<char> local_a2;
  allocator<char> local_a1;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  Tokenizer::get_current_token_abi_cxx11_(&local_40,this->tokenizer);
  bVar2 = std::operator==(&local_40,".");
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar2) {
    std::__cxx11::string::string((string *)&local_40,(string *)&this->prev_token);
    poVar4 = std::operator<<((ostream *)this->out_file,"\t\t\t\t\t<symbol>.</symbol>");
    std::endl<char,std::char_traits<char>>(poVar4);
    query_tokenizer(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"IDENTIFIER",(allocator<char> *)&local_60);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,".",&local_a2);
    check_token_type_x_after_y(this,&local_80,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    poVar4 = (ostream *)this->out_file;
    __rhs = &this->cur_token;
    std::operator+(&local_a0,"\t\t\t\t\t<identifier>",__rhs);
    std::operator+(&local_80,&local_a0,"</identifier>");
    poVar4 = std::operator<<(poVar4,(string *)&local_80);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::string((string *)&local_80,(string *)__rhs);
    query_tokenizer(this);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"(",&local_a2);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,".",&local_a1);
    check_expected_x_after_y(this,&local_a0,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_a0);
    poVar4 = std::operator<<((ostream *)this->out_file,"\t\t\t\t\t<symbol>(</symbol>");
    std::endl<char,std::char_traits<char>>(poVar4);
    query_tokenizer(this);
    bVar2 = std::operator!=(__rhs,")");
    if (bVar2) {
      parse_expression_list(this);
      pVVar1 = this->vm_writer;
      std::operator+(&local_60,&local_40,".");
      std::operator+(&local_a0,&local_60,&local_80);
      iVar3 = Symbol_Table::get_temp_arg_count(&this->symbol_table);
      VM_Writer::write_call(pVVar1,&local_a0,iVar3);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_60);
    }
    else {
      poVar4 = std::operator<<((ostream *)this->out_file,"\t\t\t\t\t<symbol>)</symbol>");
      std::endl<char,std::char_traits<char>>(poVar4);
      query_tokenizer(this);
    }
    std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    bVar2 = std::operator==(&this->cur_token,"(");
    if (!bVar2) {
      return;
    }
    std::__cxx11::string::string((string *)&local_40,(string *)&this->prev_token);
    poVar4 = std::operator<<((ostream *)this->out_file,"\t\t\t\t\t<symbol>(</symbol>");
    std::endl<char,std::char_traits<char>>(poVar4);
    query_tokenizer(this);
    bVar2 = std::operator!=(&this->cur_token,")");
    if (bVar2) {
      parse_expression_list(this);
      pVVar1 = this->vm_writer;
      iVar3 = Symbol_Table::get_arg_count(&this->symbol_table,&local_40);
      VM_Writer::write_call(pVVar1,&local_40,iVar3 + 1);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,")",(allocator<char> *)&local_60);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"(",&local_a2);
      check_expected_x_after_y(this,&local_80,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_80);
      poVar4 = std::operator<<((ostream *)this->out_file,"\t\t\t\t\t<symbol>)</symbol>");
      std::endl<char,std::char_traits<char>>(poVar4);
      query_tokenizer(this);
    }
  }
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void Parser::parse_subroutine_call() {
    // only to be called once we know Tokenizer::type() == "IDENTIFIER"

    if (tokenizer.get_current_token() == ".") {
        std::string type_name = prev_token;
        out_file << "\t\t\t\t\t<symbol>.</symbol>" << std::endl;
        query_tokenizer();

        check_token_type_x_after_y("IDENTIFIER", ".");
        out_file << "\t\t\t\t\t<identifier>" + cur_token + "</identifier>" << std::endl;
        std::string method_name = cur_token;
        query_tokenizer();

        check_expected_x_after_y("(", ".");
        out_file << "\t\t\t\t\t<symbol>(</symbol>" << std::endl;
        query_tokenizer();

        if (cur_token != ")") {
            parse_expression_list();
            vm_writer.write_call(type_name + "." + method_name, symbol_table.get_temp_arg_count());
        }
        else {
            out_file << "\t\t\t\t\t<symbol>)</symbol>" << std::endl;
            query_tokenizer();
        }
    }
    else if (cur_token == "(") {
        std::string method_name = prev_token;
        out_file << "\t\t\t\t\t<symbol>(</symbol>" << std::endl;
        query_tokenizer();

        if (cur_token != ")") {
            parse_expression_list();
            vm_writer.write_call(method_name, symbol_table.get_arg_count(method_name) + 1);
        }
        else {
            check_expected_x_after_y(")", "(");
            out_file << "\t\t\t\t\t<symbol>)</symbol>" << std::endl;
            query_tokenizer();
        }
    }
}